

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O0

double __thiscall Function::getValue(Function *this)

{
  ostream *poVar1;
  long *plVar2;
  double dVar3;
  code *local_60;
  string local_30 [32];
  Function *local_10;
  Function *this_local;
  
  local_10 = this;
  if ((this->bValueValid & 1U) == 0) {
    this->dLastValue = this->dValue;
    local_60 = (code *)this->xFunction;
    plVar2 = (long *)((long)(this->super_Physical).physicalUnit.siUnits +
                     *(long *)&this->field_0xd0 + -0x34);
    if (((ulong)local_60 & 1) != 0) {
      local_60 = *(code **)(local_60 + *plVar2 + -1);
    }
    dVar3 = (double)(*local_60)(plVar2);
    this->dValue = dVar3;
    this->bValueValid = true;
  }
  if ((this->bVerbose & 1U) != 0) {
    poVar1 = (ostream *)std::ostream::operator<<(this->oLog,this->dValue);
    poVar1 = std::operator<<(poVar1," <- ");
    (*(this->super_Physical)._vptr_Physical[0xb])();
    poVar1 = std::operator<<(poVar1,local_30);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_30);
  }
  return this->dValue;
}

Assistant:

double Function::getValue() const
{
	if (!bValueValid) {
		dLastValue = dValue;
		dValue = (this->*xFunction)();
		bValueValid = true;
	}
	if (bVerbose)
		(*oLog) << dValue << " <- " << getName() << endl;
	return dValue;
}